

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgsky(fitsfile *fptr,char *keyname,int firstchar,int maxchar,char *value,int *valuelen,
          char *comm,int *status)

{
  bool bVar1;
  size_t sVar2;
  size_t local_158;
  size_t len;
  int keynum;
  int addCommDelim;
  int commSpace;
  int contin;
  char *tempstring;
  char card [81];
  char local_d8 [8];
  char nextcomm [73];
  char valstring [71];
  int *valuelen_local;
  char *value_local;
  int maxchar_local;
  int firstchar_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  keynum = 0;
  len._4_4_ = 0;
  len._0_4_ = 0;
  if (*status < 1) {
    _commSpace = (char *)0x0;
    *value = '\0';
    if (valuelen != (int *)0x0) {
      *valuelen = 0;
    }
    tempstring._0_1_ = 0;
    if (comm != (char *)0x0) {
      *comm = '\0';
    }
    ffgcrd(fptr,keyname,(char *)&tempstring,status);
    if (*status < 1) {
      sVar2 = strlen((char *)&tempstring);
      if (sVar2 < 0x50) {
        len._4_4_ = 1;
      }
      ffpsvc((char *)&tempstring,nextcomm + 0x48,comm,status);
      if (*status < 1) {
        if (comm != (char *)0x0) {
          sVar2 = strlen(comm);
          keynum = 0x48 - (int)sVar2;
        }
        if (nextcomm[0x48] == '\0') {
          _commSpace = (char *)malloc(1);
          *_commSpace = '\0';
        }
        else {
          sVar2 = strlen(nextcomm + 0x48);
          _commSpace = (char *)malloc(sVar2 + 1);
          ffc2s(nextcomm + 0x48,_commSpace,status);
          local_158 = strlen(_commSpace);
          addCommDelim = 1;
          while( true ) {
            bVar1 = false;
            if (addCommDelim != 0) {
              bVar1 = *status < 1;
            }
            if (!bVar1) break;
            if ((local_158 == 0) || (_commSpace[local_158 - 1] != '&')) {
              addCommDelim = 0;
            }
            else {
              nextcomm[0x48] = '\0';
              local_d8[0] = '\0';
              ffgcnt(fptr,nextcomm + 0x48,local_d8,status);
              if ((nextcomm[0x48] == '\0') && (local_d8[0] == '\0')) {
                addCommDelim = 0;
              }
              else {
                _commSpace[local_158 - 1] = '\0';
                if (nextcomm[0x48] != '\0') {
                  sVar2 = strlen(nextcomm + 0x48);
                  local_158 = (sVar2 - 1) + local_158;
                  _commSpace = (char *)realloc(_commSpace,local_158 + 1);
                  strcat(_commSpace,nextcomm + 0x48);
                }
                if (((local_d8[0] != '\0') && (0 < keynum)) && (local_d8[0] != '\0')) {
                  sVar2 = strlen(comm);
                  if ((sVar2 != 0) && (len._4_4_ != 0)) {
                    strcat(comm," ");
                    keynum = keynum + -1;
                  }
                  strncat(comm,local_d8,(long)keynum);
                  sVar2 = strlen(comm);
                  keynum = 0x48 - (int)sVar2;
                }
                ffghps(fptr,(int *)0x0,(int *)&len,status);
                ffgrec(fptr,(int)len + -1,(char *)&tempstring,status);
                sVar2 = strlen((char *)&tempstring);
                len._4_4_ = (uint)(sVar2 < 0x50);
              }
            }
          }
        }
        if (_commSpace != (char *)0x0) {
          sVar2 = strlen(_commSpace);
          if ((ulong)(long)firstchar <= sVar2) {
            strncat(value,_commSpace + (firstchar + -1),(long)maxchar);
          }
          free(_commSpace);
          if (valuelen != (int *)0x0) {
            *valuelen = (int)sVar2;
          }
        }
        fptr_local._4_4_ = *status;
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgsky( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           char *value,         /* O - pointer to keyword value      */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int  *status)        /* IO - error status                 */
/*
  Read and return the value of the specified string-valued keyword.
  
  This new routine was added in 2016 to provide a more convenient user
  interface than the older ffgkls routine.

  Read a string keyword, returning up to 'naxchars' characters of the value
  starting with the 'firstchar' character.
  The input 'value' string must be allocated at least 1 char bigger to
  allow for the terminating null character.
  
  This routine may be used to read continued string keywords that use 
  the CONTINUE keyword convention, as well as normal string keywords
  that are contained within a single header record.
  
  This routine differs from the ffkls routine in that it does not
  internally allocate memory for the returned value string, and consequently
  the calling routine does not need to call fffree to free the memory.
*/
{
    char valstring[FLEN_VALUE], nextcomm[FLEN_COMMENT], card[FLEN_CARD];
    char *tempstring;
    int contin, commSpace = 0, addCommDelim=0, keynum=0;
    size_t len;

    if (*status > 0)
        return(*status);

    tempstring = NULL;  /* initialize in case of error */
    *value = '\0';
    if (valuelen) *valuelen = 0;
    
    card[0] = '\0';
    if (comm)
       comm[0] = '\0';
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    if (strlen(card) < FLEN_CARD-1)
       addCommDelim=1;
    ffpsvc(card,valstring, comm, status);    
    if (*status > 0)
        return(*status);

    if (comm)
    {
        /* remaining space in comment string */
        commSpace = FLEN_COMMENT-1 - strlen(comm);
    }
    
    if (!valstring[0])   /* null value string? */
    {
      tempstring = (char *) malloc(1);  /* allocate and return a null string */
      *tempstring = '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      tempstring = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, tempstring, status);   /* convert string to value */
      len = strlen(tempstring);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(tempstring+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            nextcomm[0] = '\0';
            ffgcnt(fptr, valstring, nextcomm, status);
            if (*valstring || *nextcomm)  /* If either valstring or nextcom
                                  is filled, this must be a CONTINUE line */  
            {
               *(tempstring+len-1) = '\0';         /* erase the trailing & char */
               if (*valstring)
               {
                  len += strlen(valstring) - 1;
                  tempstring = (char *) realloc(tempstring, len + 1); /* increase size */
                  strcat(tempstring, valstring);     /* append the continued chars */
               }
               if (*nextcomm)
               {
	          if ((commSpace > 0) && (*nextcomm != 0)) 
	          {
                     /* If in here, input 'comm' cannot be 0 */
                     /* concantenate comment strings (if any) */
                     if (strlen(comm) && addCommDelim)
                     {
                        strcat(comm, " ");
                        commSpace -=1;
                     }
		     strncat(comm, nextcomm, commSpace);
                     commSpace = FLEN_COMMENT-1 - strlen(comm);
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = (strlen(card) < FLEN_CARD-1) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    if (tempstring) 
    {
        len = strlen(tempstring);
	if (firstchar <= len)
            strncat(value, tempstring + (firstchar - 1), maxchar);
        free(tempstring);
	if (valuelen) *valuelen = len;  /* total length of the keyword value */
    }
    
    return(*status);
}